

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

StatementMap * __thiscall
Js::FunctionBody::GetMatchingStatementMapFromSource
          (FunctionBody *this,int sourceOffset,int *pMapIndex)

{
  code *pcVar1;
  bool bVar2;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  undefined4 *puVar3;
  Type *pTVar4;
  int index;
  StatementMap *this_01;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                         ((FunctionProxy *)this);
  if ((this_00 ==
       (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) ||
     (index = (this_00->
              super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              ).count, index < 1)) {
LAB_006cc640:
    index = 0;
    this_01 = (StatementMap *)0x0;
  }
  else {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xc5a,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      index = (this_00->
              super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              ).count;
    }
    do {
      index = index + -1;
      if (index < 0) goto LAB_006cc640;
      pTVar4 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      this_01 = pTVar4->ptr;
    } while ((this_01->isSubexpression == true) ||
            (bVar2 = regex::Interval::Includes(&this_01->sourceSpan,sourceOffset), !bVar2));
  }
  if (pMapIndex != (int *)0x0) {
    *pMapIndex = index;
  }
  return this_01;
}

Assistant:

FunctionBody::StatementMap* FunctionBody::GetMatchingStatementMapFromSource(int sourceOffset, int* pMapIndex /* = nullptr */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 0)
        {
            Assert(m_sourceInfo.pSpanSequence == nullptr);
            for (int index = pStatementMaps->Count() - 1; index >= 0; index--)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->sourceSpan.Includes(sourceOffset))
                {
                    if (pMapIndex)
                    {
                        *pMapIndex = index;
                    }
                    return pStatementMap;
                }
            }
        }

        if (pMapIndex)
        {
            *pMapIndex = 0;
        }
        return nullptr;
    }